

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O2

void FRemapTable::StaticSerializeTranslations(FSerializer *arc)

{
  bool bVar1;
  FRemapTable *pFVar2;
  uint local_40;
  int w;
  FRemapTablePtr local_38;
  
  bVar1 = FSerializer::BeginArray(arc,"translations");
  if (bVar1) {
    if (arc->w == (FWriter *)0x0) {
      while( true ) {
        bVar1 = FSerializer::BeginObject(arc,(char *)0x0);
        if (!bVar1) break;
        FSerializer::operator()(arc,"index",&w);
        if ((translationtables[4].super_TArray<FRemapTablePtr,_FRemapTable_*>.Count <= (uint)w) ||
           (pFVar2 = translationtables[4].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[(uint)w]
                     .Ptr, pFVar2 == (FRemapTable *)0x0)) {
          pFVar2 = (FRemapTable *)operator_new(0x20);
          FRemapTable(pFVar2,0x100);
          local_38.Ptr = pFVar2;
          TAutoGrowArray<FRemapTablePtr,_FRemapTable_*>::SetVal(translationtables + 4,w,&local_38);
        }
        Serialize(pFVar2,arc);
        FSerializer::EndObject(arc);
      }
    }
    else {
      for (local_40 = 0;
          local_40 < translationtables[4].super_TArray<FRemapTablePtr,_FRemapTable_*>.Count;
          local_40 = local_40 + 1) {
        pFVar2 = translationtables[4].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[local_40].
                 Ptr;
        if (pFVar2 != (FRemapTable *)0x0) {
          bVar1 = IsIdentity(pFVar2);
          if (!bVar1) {
            bVar1 = FSerializer::BeginObject(arc,(char *)0x0);
            if (bVar1) {
              FSerializer::operator()(arc,"index",&local_40);
              Serialize(pFVar2,arc);
              FSerializer::EndObject(arc);
            }
          }
        }
      }
    }
    FSerializer::EndArray(arc);
  }
  return;
}

Assistant:

void FRemapTable::StaticSerializeTranslations(FSerializer &arc)
{
	if (arc.BeginArray("translations"))
	{
		// Does this level have custom translations?
		FRemapTable *trans;
		int w;
		if (arc.isWriting())
		{
			for (unsigned int i = 0; i < translationtables[TRANSLATION_LevelScripted].Size(); ++i)
			{
				trans = translationtables[TRANSLATION_LevelScripted][i];
				if (trans != NULL && !trans->IsIdentity())
				{
					if (arc.BeginObject(nullptr))
					{
						arc("index", i);
						trans->Serialize(arc);
						arc.EndObject();
					}
				}
			}
		}
		else
		{
			while (arc.BeginObject(nullptr))
			{
				arc("index", w);
				trans = translationtables[TRANSLATION_LevelScripted].GetVal(w);
				if (trans == NULL)
				{
					trans = new FRemapTable;
					translationtables[TRANSLATION_LevelScripted].SetVal(w, trans);
				}
				trans->Serialize(arc);
				arc.EndObject();
			}
		}
		arc.EndArray();
	}
}